

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O2

void * ltrealloc(void *ptr,size_t sz)

{
  size_t __n;
  void *pvVar1;
  
  if (ptr != (void *)0x0) {
    if (sz == 0) {
      ltfree(ptr);
      pvVar1 = (void *)0x0;
    }
    else {
      __n = ltmsize(ptr);
      pvVar1 = ptr;
      if (__n < sz) {
        pvVar1 = ltmalloc<false>(sz);
        memcpy(pvVar1,ptr,__n);
        ltfree(ptr);
      }
    }
    return pvVar1;
  }
  pvVar1 = ltmalloc<false>(sz);
  return pvVar1;
}

Assistant:

void* ltrealloc(void* ptr, size_t sz) {
	if (!ptr) return ltmalloc(sz);
	if (!sz) return ltfree(ptr), (void*)0;
	size_t osz = ltmsize(ptr);
	if (sz <= osz) {
		return ptr;
	}
	void* nptr = memcpy(ltmalloc(sz), ptr, osz);
	ltfree(ptr);

#ifdef LTALLOC_AUTO_GC_INTERVAL
	/* this is kind of compromise; the following call number is to guarantee
	that memory gets wiped out at least every 1,000 calls between consecutive
	ltrealloc() calls (I am assuming frequency usage for regular ltrealloc() is
	smaller than ltmalloc() or ltfree() too; so that's why the check is here)
	- @r-lyeh */
	static LTALLOC_THREAD_LOCAL unsigned times = 0;
	if (!((++times) % LTALLOC_AUTO_GC_INTERVAL)) {
		ltsqueeze(0);
	}
#endif

	return nptr;
}